

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void wiz_display_item(object *obj,_Bool all,player *p)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  int16_t iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  void *p_00;
  ulong local_1a0;
  ulong local_190;
  object *local_170;
  object *local_160;
  object *local_150;
  _Bool *labelsDone;
  char buf [256];
  bitflag f [6];
  wchar_t nflg;
  wchar_t k;
  wchar_t i;
  wchar_t j;
  player *p_local;
  _Bool all_local;
  object *obj_local;
  
  if (all) {
    object_flags(obj,(bitflag *)(buf + 0xfa));
  }
  else {
    object_flags_known(obj,(bitflag *)(buf + 0xfa));
  }
  Term_clear();
  object_desc((char *)&labelsDone,0x100,obj,99,p);
  prt((char *)&labelsDone,L'\x02',L'\0');
  bVar1 = obj->dd;
  bVar2 = obj->ds;
  local_150 = obj;
  if (!all) {
    local_150 = obj->known;
  }
  wVar6 = object_to_hit(local_150);
  local_160 = obj;
  if (!all) {
    local_160 = obj->known;
  }
  wVar7 = object_to_dam(local_160);
  sVar3 = obj->ac;
  local_170 = obj;
  if (!all) {
    local_170 = obj->known;
  }
  wVar8 = object_to_ac(local_170);
  pcVar9 = format("combat = (%dd%d) (%+d,%+d) [%d,%+d]",(ulong)bVar1,(ulong)bVar2,(ulong)(uint)wVar6
                  ,(ulong)(uint)wVar7,(ulong)(uint)(int)sVar3,wVar8);
  prt(pcVar9,L'\x04',L'\0');
  uVar4 = obj->kind->kidx;
  bVar1 = obj->tval;
  bVar2 = obj->sval;
  iVar5 = object_weight_one(obj);
  pcVar9 = format("kind = %-5lu  tval = %-5d  sval = %-5d  wgt = %-3d     timeout = %-d",
                  (ulong)uVar4,(ulong)bVar1,(ulong)bVar2,(ulong)(uint)(int)iVar5,
                  (ulong)(uint)(int)obj->timeout);
  prt(pcVar9,L'\x05',L'\0');
  bVar1 = obj->number;
  sVar3 = obj->pval;
  if (obj->artifact == (artifact *)0x0) {
    local_190 = 0;
  }
  else {
    local_190 = (ulong)obj->artifact->aidx;
  }
  if (obj->ego == (ego_item *)0x0) {
    local_1a0 = 0xffffffffffffffff;
  }
  else {
    local_1a0 = (ulong)obj->ego->eidx;
  }
  wVar6 = object_value(obj,L'\x01');
  pcVar9 = format("number = %-3d  pval = %-5d  name1 = %-4ld  egoidx = %-4ld  cost = %ld",
                  (ulong)bVar1,(ulong)(uint)(int)sVar3,local_190,local_1a0,(long)wVar6);
  prt(pcVar9,L'\x06',L'\0');
  for (nflg = L'\x01'; nflg < L'\x13'; nflg = nflg + L'\x01') {
    buf[(long)nflg + -8] = '-';
  }
  labelsDone._0_1_ = 0x2b;
  builtin_strncpy(buf + 0xb,"FLAGS",5);
  for (nflg = L'\x18'; nflg < L'+'; nflg = nflg + L'\x01') {
    buf[(long)nflg + -8] = '-';
  }
  buf[0x23] = '+';
  buf[0x24] = '\0';
  prt((char *)&labelsDone,L'\x10',L'\0');
  p_00 = mem_zalloc(0x2c);
  f[2] = '\0';
  f[3] = '\0';
  f[4] = '\0';
  f[5] = '\0';
  for (; (int)f._2_4_ < 5; f._2_4_ = f._2_4_ + 1) {
    for (nflg = L'\0'; nflg < L','; nflg = nflg + L'\x01') {
      if ((*(byte *)((long)p_00 + (long)nflg) & 1) == 0) {
        if (wiz_display_item::flagLabels[nflg][(int)f._2_4_] == '\0') {
          *(undefined1 *)((long)p_00 + (long)nflg) = 1;
          buf[(long)nflg + -8] = ' ';
        }
        else {
          buf[(long)nflg + -8] = wiz_display_item::flagLabels[nflg][(int)f._2_4_];
        }
      }
      else {
        buf[(long)nflg + -8] = ' ';
      }
    }
    buf[0x24] = '\0';
    prt((char *)&labelsDone,f._2_4_ + L'\x11',L'\0');
  }
  mem_free(p_00);
  prt_binary((bitflag *)(buf + 0xfa),L'\0',L'\x16',L'\0',L'*',L',');
  if (obj->known != (object *)0x0) {
    prt_binary(obj->known->flags,L'\0',L'\x17',L'\0',L'+',L',');
  }
  return;
}

Assistant:

static void wiz_display_item(const struct object *obj, bool all,
		const struct player *p)
{
	static const char *flagLabels[] = {
		#define OF(a, b) b,
		#include "list-object-flags.h"
		#undef OF
	};
	int j = 0, i, k, nflg;
	bitflag f[OF_SIZE];
	char buf[256];
	bool *labelsDone;

	/* Extract the flags. */
	if (all) {
		object_flags(obj, f);
	} else {
		object_flags_known(obj, f);
	}

	/* Clear screen. */
	Term_clear();

	/* Describe fully */
	object_desc(buf, sizeof(buf), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, p);

	prt(buf, 2, j);

	prt(format("combat = (%dd%d) (%+d,%+d) [%d,%+d]",
		obj->dd, obj->ds, object_to_hit(all ? obj : obj->known),
		object_to_dam(all ? obj : obj->known), obj->ac,
		object_to_ac(all ? obj : obj->known)), 4, j);

	prt(format("kind = %-5lu  tval = %-5d  sval = %-5d  wgt = %-3d     timeout = %-d",
		(unsigned long)obj->kind->kidx, obj->tval, obj->sval,
		object_weight_one(obj), obj->timeout), 5, j);

	prt(format("number = %-3d  pval = %-5d  name1 = %-4ld  egoidx = %-4ld  cost = %ld",
		obj->number, obj->pval,
		obj->artifact ? (long)obj->artifact->aidx : 0L,
		obj->ego ? (long)obj->ego->eidx : -1L,
		(long)object_value(obj, 1)), 6, j);

	nflg = MIN(OF_MAX - FLAG_START, 80);

	/* Set up header line. */
	if (nflg >= 6) {
		buf[0] = '+';
		k = (nflg - 6) / 2;
		for (i = 1; i < k; ++i) {
			buf[i] = '-';
		}
	} else {
		k = 0;
	}
	buf[k] = 'F';
	buf[k + 1] = 'L';
	buf[k + 2] = 'A';
	buf[k + 3] = 'G';
	buf[k + 4] = 'S';
	for (i = k + 5; i < nflg - 1; ++i) {
		buf[i] = '-';
	}
	if (nflg >= 7) {
		buf[nflg - 1] = '+';
		buf[nflg] = '\0';
	} else {
		buf[k + 5] = '\0';
	}
	prt(buf, 16, j);

	/* Display first five letters of flag labels vertically. */
	labelsDone = mem_zalloc(nflg * sizeof(*labelsDone));
	for (k = 0; k < 5; ++k) {
		for (i = 0; i < nflg; ++i) {
			if (labelsDone[i]) {
				buf[i] = ' ';
			} else if (flagLabels[i][k] == '\0') {
				labelsDone[i] = true;
				buf[i] = ' ';
			} else {
				buf[i] = flagLabels[i][k];
			}
		}
		buf[nflg] = '\0';
		prt(buf, 17 + k, j);
	}
	mem_free(labelsDone);

	prt_binary(f, 0, 22, j, L'*', nflg);
	if (obj->known) {
		prt_binary(obj->known->flags, 0, 23, j, L'+', nflg);
	}
}